

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_bnd.c
# Opt level: O0

int func(N_Vector u,N_Vector f,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined4 local_8c;
  int j;
  int i;
  realtype *fdata;
  realtype *udata;
  realtype urt;
  realtype ult;
  realtype uup;
  realtype udn;
  realtype uij;
  realtype vdc;
  realtype hdc;
  realtype vdiff;
  realtype hdiff;
  realtype dy;
  realtype dx;
  void *user_data_local;
  N_Vector f_local;
  N_Vector u_local;
  
  lVar2 = N_VGetArrayPointer_Serial(u);
  lVar3 = N_VGetArrayPointer_Serial(f);
  for (local_90 = 1; local_90 < 0x20; local_90 = local_90 + 1) {
    for (local_8c = 1; local_8c < 0x20; local_8c = local_8c + 1) {
      dVar1 = *(double *)(lVar2 + (long)(local_90 + -1 + (local_8c + -1) * 0x1f) * 8);
      if (local_90 == 1) {
        local_98 = 0.0;
      }
      else {
        local_98 = *(double *)(lVar2 + (long)(local_90 + -2 + (local_8c + -1) * 0x1f) * 8);
      }
      if (local_90 == 0x1f) {
        local_a0 = 0.0;
      }
      else {
        local_a0 = *(double *)(lVar2 + (long)(local_90 + (local_8c + -1) * 0x1f) * 8);
      }
      if (local_8c == 1) {
        local_a8 = 0.0;
      }
      else {
        local_a8 = *(double *)(lVar2 + (long)(local_90 + -1 + (local_8c + -2) * 0x1f) * 8);
      }
      if (local_8c == 0x1f) {
        local_b0 = 0.0;
      }
      else {
        local_b0 = *(double *)(lVar2 + (long)(local_90 + -1 + local_8c * 0x1f) * 8);
      }
      *(double *)(lVar3 + (long)(local_90 + -1 + (local_8c + -1) * 0x1f) * 8) =
           -(dVar1 * dVar1) * dVar1 +
           ((local_a8 - (dVar1 + dVar1)) + local_b0) * 1024.0 +
           ((local_a0 - (dVar1 + dVar1)) + local_98) * 1024.0 + dVar1 + 2.0;
    }
  }
  return 0;
}

Assistant:

static int func(N_Vector u, N_Vector f, void *user_data)
{
  realtype dx, dy, hdiff, vdiff;
  realtype hdc, vdc;
  realtype uij, udn, uup, ult, urt;
  realtype *udata, *fdata;

  int i, j;

  dx = ONE/(NX+1);
  dy = ONE/(NY+1);
  hdc = ONE/(dx*dx);
  vdc = ONE/(dy*dy);

  udata = N_VGetArrayPointer_Serial(u);
  fdata = N_VGetArrayPointer_Serial(f);

  for (j=1; j <= NY; j++) {
    for (i=1; i <= NX; i++) {

      /* Extract u at x_i, y_j and four neighboring points */

      uij = IJth(udata, i, j);
      udn = (j == 1)  ? ZERO : IJth(udata, i, j-1);
      uup = (j == NY) ? ZERO : IJth(udata, i, j+1);
      ult = (i == 1)  ? ZERO : IJth(udata, i-1, j);
      urt = (i == NX) ? ZERO : IJth(udata, i+1, j);

      /* Evaluate diffusion components */

      hdiff = hdc*(ult - TWO*uij + urt);
      vdiff = vdc*(uup - TWO*uij + udn);

      /* Set residual at x_i, y_j */

      IJth(fdata, i, j) = hdiff + vdiff + uij - uij*uij*uij + 2.0;

    }
  }

  return(0);
}